

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

bool NULLC::IsDerivedFrom(NULLCRef derived,uint base)

{
  char *pcVar1;
  uint uVar2;
  
  if (*(uint *)(linker + 0x20c) <= base) {
LAB_0011f699:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x7f,
                  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                 );
  }
  if ((*(byte *)(*(long *)(linker + 0x200) + 0x15 + (ulong)base * 0x50) & 4) == 0) {
    pcVar1 = nullcGetTypeName(base);
    nullcThrowError("ERROR: type \'%s\' is not extendable",pcVar1);
  }
  do {
    uVar2 = derived.typeID;
    if (uVar2 == base) break;
    if (*(uint *)(linker + 0x20c) <= uVar2) goto LAB_0011f699;
    derived.typeID = *(uint *)(*(long *)(linker + 0x200) + 0x4c + (ulong)uVar2 * 0x50);
  } while (derived.typeID != 0);
  return uVar2 == base;
}

Assistant:

bool NULLC::IsDerivedFrom(NULLCRef derived, unsigned base)
{
	if((linker->exTypes[base].typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) == 0)
		nullcThrowError("ERROR: type '%s' is not extendable", nullcGetTypeName(base));

	unsigned typeId = derived.typeID;

	for(;;)
	{
		if(base == typeId)
			return true;

		if(linker->exTypes[typeId].baseType)
		{
			typeId = linker->exTypes[typeId].baseType;
		}
		else
		{
			break;
		}
	}

	return false;
}